

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwpq_vdpp_proc.cpp
# Opt level: O3

int hwpq_vdpp_deinit(rk_vdpp_context ctx)

{
  vdpp_com_ctx *com_ctx;
  _func_MPP_RET_VdppCtx *p_Var1;
  MPP_RET MVar2;
  
  if (((byte)hwpq_vdpp_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"line(%d), func(%s), enter",(char *)0x0,0x249,"hwpq_vdpp_deinit");
  }
  if (ctx == (rk_vdpp_context)0x0) {
    _mpp_log_l(2,(char *)0x0,"found NULL input ctx %p\n","hwpq_vdpp_deinit",0);
  }
  else {
    com_ctx = *ctx;
    if ((com_ctx != (vdpp_com_ctx *)0x0) && (com_ctx->ops != (vdpp_com_ops *)0x0)) {
      p_Var1 = com_ctx->ops->deinit;
      if (p_Var1 == (_func_MPP_RET_VdppCtx *)0x0) {
        MVar2 = MPP_NOK;
      }
      else {
        MVar2 = (*p_Var1)(com_ctx->priv);
        if (MVar2 == MPP_OK) {
          MVar2 = MPP_OK;
        }
        else {
          _mpp_log_l(2,(char *)0x0,"vdpp deinit failed! ret %d\n","hwpq_vdpp_deinit",
                     (ulong)(uint)MVar2);
        }
      }
      if (*(MppBuffer *)((long)ctx + 0x10) != (MppBuffer)0x0) {
        mpp_buffer_put_with_caller(*(MppBuffer *)((long)ctx + 0x10),"hwpq_vdpp_deinit");
        *(undefined8 *)((long)ctx + 0x10) = 0;
      }
      if (*(MppBufferGroup *)((long)ctx + 8) != (MppBufferGroup)0x0) {
        mpp_buffer_group_put(*(MppBufferGroup *)((long)ctx + 8));
        *(undefined8 *)((long)ctx + 8) = 0;
      }
      rockchip_vdpp_api_release_ctx(com_ctx);
      mpp_osal_free("hwpq_vdpp_deinit",ctx);
      if (((byte)hwpq_vdpp_debug & 1) == 0) {
        return MVar2;
      }
      _mpp_log_l(4,(char *)0x0,"line(%d), func(%s), leave",(char *)0x0,0x26b,"hwpq_vdpp_deinit");
      return MVar2;
    }
    _mpp_log_l(2,(char *)0x0,"found NULL vdpp\n","hwpq_vdpp_deinit");
  }
  return -3;
}

Assistant:

int hwpq_vdpp_deinit(rk_vdpp_context ctx)
{
    VdppCtxImpl *p = (VdppCtxImpl*)ctx;
    vdpp_com_ctx* vdpp = NULL;
    MPP_RET ret = MPP_NOK;

    hwpq_vdpp_enter();

    if (NULL == ctx) {
        mpp_err_f("found NULL input ctx %p\n", ctx);
        ret = MPP_ERR_NULL_PTR;
        goto __RET;
    }

    vdpp = p->vdpp;
    if (NULL == vdpp || NULL == vdpp->ops) {
        mpp_err_f("found NULL vdpp\n");
        ret = MPP_ERR_NULL_PTR;
        goto __RET;
    }

    if (vdpp->ops->deinit) {
        ret = vdpp->ops->deinit(vdpp->priv);
        if (ret) {
            mpp_err_f("vdpp deinit failed! ret %d\n", ret);
        }
    }

    if (p->histbuf) {
        mpp_buffer_put(p->histbuf);
        p->histbuf = NULL;
    }

    if (p->memGroup) {
        mpp_buffer_group_put(p->memGroup);
        p->memGroup = NULL;
    }

    rockchip_vdpp_api_release_ctx(vdpp);
    MPP_FREE(p);
    hwpq_vdpp_leave();

__RET:
    return ret;
}